

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls_openssl.cpp
# Opt level: O1

QByteArray * __thiscall
QDtlsPrivateOpenSSL::decryptDatagram
          (QByteArray *__return_storage_ptr__,QDtlsPrivateOpenSSL *this,QUdpSocket *socket,
          QByteArray *tlsdgram)

{
  QDtlsBasePrivate *pQVar1;
  SSL *a;
  Data *pDVar2;
  int iVar3;
  uint uVar4;
  unsigned_long uVar5;
  long in_FS_OFFSET;
  QAnyStringView QVar6;
  QArrayData *local_78;
  int local_70;
  QChar local_68;
  QArrayData *local_60 [3];
  QArrayData *local_48 [3];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArray::operator=(&(this->dtls).dgram,tlsdgram);
  (this->dtls).udpSocket = socket;
  pQVar1 = &this->super_QDtlsBasePrivate;
  (**(code **)(*(long *)&this->super_QDtlsBasePrivate + 0x28))(pQVar1);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char *)0x0;
  (__return_storage_ptr__->d).size = 0;
  QByteArray::resize((longlong)__return_storage_ptr__);
  a = (this->dtls).tlsConnection.value.ptr;
  pDVar2 = (__return_storage_ptr__->d).d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
    QByteArray::reallocData
              ((longlong)__return_storage_ptr__,(AllocationOption)(__return_storage_ptr__->d).size);
  }
  iVar3 = q_SSL_read(a,(__return_storage_ptr__->d).ptr,(int)(__return_storage_ptr__->d).size);
  if (0 < iVar3) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      QByteArray::resize((longlong)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    goto LAB_0013ab88;
  }
  QByteArray::clear();
  uVar5 = q_ERR_get_error();
  if (uVar5 == 0) {
    uVar4 = q_SSL_get_shutdown((this->dtls).tlsConnection.value.ptr);
    uVar5 = 6;
    if ((uVar4 & 2) != 0) goto LAB_0013a9ef;
  }
  else {
LAB_0013a9ef:
    if (1 < uVar5 - 2) {
      if (uVar5 == 6) {
        this->connectionWasShutdown = true;
        QMetaObject::tr((char *)local_48,(char *)&QDtls::staticMetaObject,0x13fddf);
        (**(code **)(*(long *)&this->super_QDtlsBasePrivate + 0x10))(pQVar1,4,local_48);
        if (local_48[0] != (QArrayData *)0x0) {
          LOCK();
          (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_48[0],2,0x10);
          }
        }
        dtlsopenssl::DtlsState::reset(&this->dtls);
        this->connectionEncrypted = false;
        this->handshakeState = HandshakeNotStarted;
      }
      else {
        QMetaObject::tr((char *)local_60,(char *)&QDtls::staticMetaObject,0x13cdc0);
        QTlsBackendOpenSSL::getErrorsFromOpenSsl();
        QVar6.m_size = (size_t)local_60;
        QVar6.field_0.m_data = local_48;
        QString::arg_impl(QVar6,local_70,local_68);
        (**(code **)(*(long *)pQVar1 + 0x10))(pQVar1,8,local_48);
        if (local_48[0] != (QArrayData *)0x0) {
          LOCK();
          (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_48[0],2,0x10);
          }
        }
        if (local_78 != (QArrayData *)0x0) {
          LOCK();
          (local_78->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_78->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_78->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_78,2,0x10);
          }
        }
        if (local_60[0] != (QArrayData *)0x0) {
          LOCK();
          (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_60[0],2,0x10);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
LAB_0013ab88:
  __stack_chk_fail();
}

Assistant:

QByteArray QDtlsPrivateOpenSSL::decryptDatagram(QUdpSocket *socket, const QByteArray &tlsdgram)
{
    Q_ASSERT(socket);
    Q_ASSERT(tlsdgram.size());

    Q_ASSERT(dtls.tlsConnection.data());
    Q_ASSERT(connectionEncrypted);

    dtls.dgram = tlsdgram;
    dtls.udpSocket = socket;

    clearDtlsError();

    QByteArray dgram;
    dgram.resize(tlsdgram.size());
    const int read = q_SSL_read(dtls.tlsConnection.data(), dgram.data(),
                                dgram.size());

    if (read > 0) {
        dgram.resize(read);
        return dgram;
    }

    dgram.clear();
    unsigned long errorCode = q_ERR_get_error();
    if (errorCode == SSL_ERROR_NONE) {
        const int shutdown = q_SSL_get_shutdown(dtls.tlsConnection.data());
        if (shutdown & SSL_RECEIVED_SHUTDOWN)
            errorCode = SSL_ERROR_ZERO_RETURN;
        else
            return dgram;
    }

    switch (errorCode) {
    case SSL_ERROR_WANT_READ:
    case SSL_ERROR_WANT_WRITE:
        return dgram;
    case SSL_ERROR_ZERO_RETURN:
        // "The connection was shut down cleanly" ... hmm, whatever,
        // needs testing (DTLSTODO).
        connectionWasShutdown = true;
        setDtlsError(QDtlsError::RemoteClosedConnectionError,
                     QDtls::tr("The DTLS connection has been shutdown"));
        dtls.reset();
        connectionEncrypted = false;
        handshakeState = QDtls::HandshakeNotStarted;
        return dgram;
    case SSL_ERROR_SYSCALL: // some IO error
    case SSL_ERROR_SSL:     // error in the SSL library
        // DTLSTODO: Apparently, some errors can be ignored, for example,
        // ECONNRESET etc. This all needs a lot of testing!!!
    default:
        setDtlsError(QDtlsError::TlsNonFatalError,
                     QDtls::tr("Error while reading: %1")
                               .arg(QTlsBackendOpenSSL::getErrorsFromOpenSsl()));
        return dgram;
    }
}